

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PairList.cpp
# Opt level: O3

int * __thiscall OpenMD::PairList::getPairList(PairList *this)

{
  _Rb_tree_header *p_Var1;
  pointer piVar2;
  undefined8 in_RAX;
  int *piVar3;
  _Base_ptr p_Var4;
  int *piVar5;
  int iVar6;
  iterator iVar7;
  undefined8 local_38;
  
  if (this->modified_ == true) {
    piVar2 = (this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar2) {
      (this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar2;
    }
    p_Var4 = (this->pairSet_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->pairSet_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var1) {
      local_38 = in_RAX;
      do {
        iVar6 = p_Var4[1]._M_color + _S_black;
        iVar7._M_current =
             (this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        piVar3 = (this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        local_38._4_4_ = iVar6;
        if (iVar7._M_current == piVar3) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&this->pairList_,iVar7,(int *)((long)&local_38 + 4));
          iVar7._M_current =
               (this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          piVar3 = (this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar7._M_current = iVar6;
          iVar7._M_current = iVar7._M_current + 1;
          (this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar7._M_current;
        }
        iVar6 = *(int *)&p_Var4[1].field_0x4 + 1;
        local_38 = CONCAT44(local_38._4_4_,iVar6);
        if (iVar7._M_current == piVar3) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&this->pairList_,iVar7,(int *)&local_38);
        }
        else {
          *iVar7._M_current = iVar6;
          (this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar7._M_current + 1;
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var1);
    }
    this->modified_ = false;
  }
  piVar3 = (this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (int *)0x0;
  if (piVar3 != (this->pairList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    piVar5 = piVar3;
  }
  return piVar5;
}

Assistant:

int* PairList::getPairList() {
    if (modified_) {
      pairList_.clear();

      for (std::set<std::pair<int, int>>::iterator i = pairSet_.begin();
           i != pairSet_.end(); ++i) {
        pairList_.push_back(i->first + 1);
        pairList_.push_back(i->second + 1);
      }
      modified_ = false;
    }

    return pairList_.empty() ? NULL : &(pairList_[0]);
  }